

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

SIZE_T ObtainCurrentThreadIdImpl(CPalThread *pCurrentThread,char *callingFuncName)

{
  DWORD DVar1;
  SIZE_T local_20;
  SIZE_T threadId;
  char *callingFuncName_local;
  CPalThread *pCurrentThread_local;
  
  if (pCurrentThread == (CPalThread *)0x0) {
    DVar1 = GetCurrentThreadId();
    local_20 = (SIZE_T)DVar1;
  }
  else {
    local_20 = CorUnix::CPalThread::GetThreadId(pCurrentThread);
  }
  if (local_20 == 0) {
    fprintf(_stderr,"] %s %s:%d","ObtainCurrentThreadIdImpl",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0xbf);
    fprintf(_stderr,"Expression: 0 != threadId\n");
  }
  return local_20;
}

Assistant:

static SIZE_T ObtainCurrentThreadIdImpl(CPalThread *pCurrentThread, const char *callingFuncName)
{
    SIZE_T threadId;
    if(pCurrentThread)
    {
        threadId = pCurrentThread->GetThreadId();
    }
    else
    {
        threadId = GetCurrentThreadId();
        CS_TRACE("Early %s, no pthread data, getting TID internally\n", callingFuncName);
    }
    _ASSERTE(0 != threadId);

    return threadId;
}